

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O3

void __thiscall MemorySSADumper::dumpSubgraphLabel(MemorySSADumper *this,RWSubgraph *subgraph)

{
  const_iterator cVar1;
  RWSubgraph *local_28;
  
  local_28 = subgraph;
  cVar1 = std::
          _Hashtable<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)(((this->super_Dumper).DDA)->DDA)._M_t.
                              super___uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_dg::dda::DataDependenceAnalysis_*,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                              .super__Head_base<0UL,_dg::dda::DataDependenceAnalysis_*,_false>.
                              _M_head_impl + 0x128),&local_28);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_false>
      ._M_cur == (__node_type *)0x0) {
    printf("  label=<<table cellborder=\"0\">\n<tr><td>subgraph %s(%p)</td></tr>\n<tr><td>no summary</td></tr></table>>;\n"
           ,*(undefined8 *)(subgraph + 0x30),subgraph);
  }
  else {
    printf("  label=<<table cellborder=\"0\"><tr><td colspan=\"4\">subgraph %s (%p)</td></tr>\n<tr><td colspan=\"4\">-- summary -- </td></tr>\n"
           ,*(undefined8 *)(subgraph + 0x30),subgraph);
    printf("<tr><td colspan=\"4\">==  inputs ==</td></tr>");
    dumpDDIMap(this,(DefinitionsMap<dg::dda::RWNode> *)
                    ((long)cVar1.
                           super__Node_iterator_base<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_false>
                           ._M_cur + 0x48));
    printf("<tr><td colspan=\"4\">==  outputs ==</td></tr>");
    dumpDDIMap(this,(DefinitionsMap<dg::dda::RWNode> *)
                    ((long)cVar1.
                           super__Node_iterator_base<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_false>
                           ._M_cur + 0x80));
    puts("</table>>;");
  }
  return;
}

Assistant:

void dumpSubgraphLabel(RWSubgraph *subgraph) override {
        auto *SSA = static_cast<MemorySSATransformation *>(
                DDA->getDDA()->getImpl());
        const auto *summary = SSA->getSummary(subgraph);

        if (!summary) {
            printf("  label=<<table cellborder=\"0\">\n"
                   "<tr><td>subgraph %s(%p)</td></tr>\n"
                   "<tr><td>no summary</td></tr></table>>;\n",
                   subgraph->getName().c_str(), subgraph);
            return;
        }

        printf("  label=<<table cellborder=\"0\"><tr><td "
               "colspan=\"4\">subgraph %s (%p)</td></tr>\n"
               "<tr><td colspan=\"4\">-- summary -- </td></tr>\n",
               subgraph->getName().c_str(), subgraph);
        printf("<tr><td colspan=\"4\">==  inputs ==</td></tr>");
        dumpDDIMap(summary->inputs);
        printf("<tr><td colspan=\"4\">==  outputs ==</td></tr>");
        dumpDDIMap(summary->outputs);
        printf("</table>>;\n");
    }